

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateImportedGenerationObjects
          (cmGlobalGenerator *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   *exports)

{
  pointer *pppcVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pbVar4;
  pointer puVar5;
  iterator __position;
  cmGeneratorTarget *in_RAX;
  pointer puVar6;
  long lVar7;
  string *t;
  pointer name;
  pointer puVar8;
  cmGeneratorTarget *gt;
  cmGeneratorTarget *local_38;
  
  local_38 = in_RAX;
  CreateGenerationObjects(this,ImportedOnly);
  puVar2 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)puVar3 - (long)puVar2 >> 5;
  puVar6 = puVar2;
  if (0 < lVar7) {
    puVar6 = (pointer)((long)&(puVar2->_M_t).
                              super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                              .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl +
                      ((long)puVar3 - (long)puVar2 & 0xffffffffffffffe0U));
    lVar7 = lVar7 + 1;
    puVar8 = puVar2 + 2;
    do {
      if (puVar8[-2]._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
          super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) {
        puVar8 = puVar8 + -2;
        goto LAB_004140cb;
      }
      if (puVar8[-1]._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
          super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) {
        puVar8 = puVar8 + -1;
        goto LAB_004140cb;
      }
      if ((puVar8->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
          super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) goto LAB_004140cb;
      if (puVar8[1]._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
          super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) {
        puVar8 = puVar8 + 1;
        goto LAB_004140cb;
      }
      lVar7 = lVar7 + -1;
      puVar8 = puVar8 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)puVar3 - (long)puVar6 >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      puVar8 = puVar3;
      if ((lVar7 != 3) ||
         (puVar8 = puVar6,
         (puVar6->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
         super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
         super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf)) goto LAB_004140cb;
      puVar6 = puVar6 + 1;
    }
    puVar8 = puVar6;
    if ((puVar6->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
        super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
        super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) goto LAB_004140cb;
    puVar6 = puVar6 + 1;
  }
  puVar8 = puVar3;
  if ((puVar6->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
      super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl == mf) {
    puVar8 = puVar6;
  }
LAB_004140cb:
  name = (targets->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (targets->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name != pbVar4) {
    puVar5 = (this->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_38 = cmLocalGenerator::FindGeneratorTargetToUse
                           (*(cmLocalGenerator **)((long)puVar8 + ((long)puVar5 - (long)puVar2)),
                            name);
      if (local_38 != (cmGeneratorTarget *)0x0) {
        __position._M_current =
             (exports->
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (exports->
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
          _M_realloc_insert<cmGeneratorTarget_const*const&>
                    ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                     exports,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppcVar1 = &(exports->
                      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      name = name + 1;
    } while (name != pbVar4);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateImportedGenerationObjects(
  cmMakefile* mf, const std::vector<std::string>& targets,
  std::vector<const cmGeneratorTarget*>& exports)
{
  this->CreateGenerationObjects(ImportedOnly);
  auto const mfit =
    std::find_if(this->Makefiles.begin(), this->Makefiles.end(),
                 [mf](const std::unique_ptr<cmMakefile>& item) {
                   return item.get() == mf;
                 });
  auto& lg =
    this->LocalGenerators[std::distance(this->Makefiles.begin(), mfit)];
  for (std::string const& t : targets) {
    cmGeneratorTarget* gt = lg->FindGeneratorTargetToUse(t);
    if (gt) {
      exports.push_back(gt);
    }
  }
}